

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall
helics::apps::Player::addEndpoint(Player *this,string_view endpointName,string_view endpointType)

{
  _Map_pointer ppEVar1;
  _Map_pointer ppEVar2;
  _Elt_pointer pEVar3;
  Endpoint *pEVar4;
  _Elt_pointer pEVar5;
  iterator iVar6;
  string *psVar7;
  mapped_type *pmVar8;
  size_t sVar9;
  Endpoint *pEVar10;
  ulong uVar11;
  InterfaceVisibility local_4c;
  key_type local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  key_type local_28;
  
  local_38._M_str = endpointType._M_str;
  local_38._M_len = endpointType._M_len;
  local_48._M_str = endpointName._M_str;
  local_48._M_len = endpointName._M_len;
  iVar6 = CLI::std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->eptids)._M_h,&local_48);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    if ((this->super_App).useLocal == false) {
LAB_00274584:
      local_4c = GLOBAL;
      local_28._M_len =
           (size_t)(this->super_App).fed.
                   super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
      std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::
      emplace_back<helics::InterfaceVisibility,helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)&this->endpoints,
                 &local_4c,(CombinationFederate **)&local_28,&local_48,&local_38);
    }
    else {
      if (local_48._M_len != 0) {
        sVar9 = 0;
        do {
          if (0xfd < (byte)(local_48._M_str[sVar9] - 0x30U)) goto LAB_00274584;
          sVar9 = sVar9 + 1;
        } while (local_48._M_len != sVar9);
      }
      local_28._M_len =
           (size_t)(this->super_App).fed.
                   super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
      std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::
      emplace_back<helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)&this->endpoints,
                 (CombinationFederate **)&local_28,&local_48,&local_38);
    }
    ppEVar1 = (this->endpoints).
              super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    ppEVar2 = (this->endpoints).
              super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    pEVar3 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    pEVar10 = (this->endpoints).
              super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    pEVar4 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first;
    uVar11 = (long)pEVar10 - (long)pEVar4;
    pEVar5 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if (pEVar10 == pEVar4) {
      pEVar10 = ppEVar1[-1] + 4;
    }
    psVar7 = Interface::getName_abi_cxx11_(&pEVar10[-1].super_Interface);
    local_28._M_str = (psVar7->_M_dataplus)._M_p;
    local_28._M_len = psVar7->_M_string_length;
    pmVar8 = CLI::std::__detail::
             _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->eptids,&local_28);
    *pmVar8 = (int)((ulong)((long)pEVar3 - (long)pEVar5) >> 3) * -0x11111111 +
              (int)(uVar11 >> 3) * -0x11111111 +
              ((int)((ulong)((long)ppEVar1 - (long)ppEVar2) >> 3) + -1 +
              (uint)(ppEVar1 == (_Map_pointer)0x0)) * 4 + -1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Endpoint already exists\n",0x18);
  }
  return;
}

Assistant:

void Player::addEndpoint(std::string_view endpointName, std::string_view endpointType)
{
    // skip already existing publications
    if (eptids.find(endpointName) != eptids.end()) {
        std::cerr << "Endpoint already exists\n";
        return;
    }
    if (!useLocal) {
        endpoints.emplace_back(helics::InterfaceVisibility::GLOBAL,
                               fed.get(),
                               endpointName,
                               endpointType);
    } else {
        auto kp = endpointName.find_first_of("./");
        if (kp == std::string::npos) {
            endpoints.emplace_back(fed.get(), endpointName, endpointType);
        } else {
            endpoints.emplace_back(helics::InterfaceVisibility::GLOBAL,
                                   fed.get(),
                                   endpointName,
                                   endpointType);
        }
    }
    eptids[endpoints.back().getName()] = static_cast<int>(endpoints.size()) - 1;
}